

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

uint llvm::APInt::tcMSB(WordType *parts,uint n)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  iVar3 = n * -0x40;
  uVar4 = n - 1;
  do {
    iVar3 = iVar3 + 0x40;
    uVar1 = parts[uVar4];
    if (uVar1 != 0) {
      lVar2 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      return ((uint)lVar2 ^ 0x3f) - iVar3 ^ 0x3f;
    }
    bVar5 = uVar4 != 0;
    uVar4 = uVar4 - 1;
  } while (bVar5);
  return 0xffffffff;
}

Assistant:

unsigned APInt::tcMSB(const WordType *parts, unsigned n) {
  do {
    --n;

    if (parts[n] != 0) {
      unsigned msb = partMSB(parts[n]);

      return msb + n * APINT_BITS_PER_WORD;
    }
  } while (n);

  return -1U;
}